

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderingParameters.hpp
# Opt level: O0

Matrix4f * __thiscall
eos::fitting::RenderingParameters::get_modelview
          (Matrix4f *__return_storage_ptr__,RenderingParameters *this)

{
  Scalar SVar1;
  float fVar2;
  bool bVar3;
  Scalar *pSVar4;
  float *pfVar5;
  Type local_f8;
  QuaternionBase<Eigen::Quaternion<float,_0>_> local_c8 [24];
  Matrix3 local_b0;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  local_8b [3];
  Type local_88;
  QuaternionBase<Eigen::Quaternion<float,_0>_> local_58 [24];
  Matrix3 local_40;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  local_1b [3];
  RenderingParameters *local_18;
  RenderingParameters *this_local;
  Matrix4f *modelview;
  
  local_18 = this;
  this_local = (RenderingParameters *)__return_storage_ptr__;
  if (this->camera_type == Orthographic) {
    Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity();
    Eigen::Matrix<float,4,4,0,4,4>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
              ((Matrix<float,4,4,0,4,4> *)__return_storage_ptr__,local_1b);
    Eigen::QuaternionBase<Eigen::Quaternion<float,_0>_>::normalized(local_58);
    Eigen::QuaternionBase<Eigen::Quaternion<float,_0>_>::toRotationMatrix(&local_40,local_58);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::block<3,3>
              (&local_88,(DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)__return_storage_ptr__,0,0);
    Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,3,3,false>::operator=
              ((Block<Eigen::Matrix<float,4,4,0,4,4>,3,3,false> *)&local_88,
               (DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)&local_40);
    SVar1 = this->t_x;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_1> *)
                        __return_storage_ptr__,0,3);
    *pSVar4 = SVar1;
    SVar1 = this->t_y;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_1> *)
                        __return_storage_ptr__,1,3);
    *pSVar4 = SVar1;
  }
  else {
    bVar3 = std::optional<float>::has_value(&this->t_z);
    if (!bVar3) {
      __assert_fail("t_z.has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/RenderingParameters.hpp"
                    ,0xe7,"Eigen::Matrix4f eos::fitting::RenderingParameters::get_modelview() const"
                   );
    }
    Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity();
    Eigen::Matrix<float,4,4,0,4,4>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
              ((Matrix<float,4,4,0,4,4> *)__return_storage_ptr__,local_8b);
    Eigen::QuaternionBase<Eigen::Quaternion<float,_0>_>::normalized(local_c8);
    Eigen::QuaternionBase<Eigen::Quaternion<float,_0>_>::toRotationMatrix(&local_b0,local_c8);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::block<3,3>
              (&local_f8,(DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)__return_storage_ptr__,0,0);
    Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,3,3,false>::operator=
              ((Block<Eigen::Matrix<float,4,4,0,4,4>,3,3,false> *)&local_f8,
               (DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)&local_b0);
    SVar1 = this->t_x;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_1> *)
                        __return_storage_ptr__,0,3);
    *pSVar4 = SVar1;
    SVar1 = this->t_y;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_1> *)
                        __return_storage_ptr__,1,3);
    *pSVar4 = SVar1;
    pfVar5 = std::optional<float>::value(&this->t_z);
    fVar2 = *pfVar5;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_1> *)
                        __return_storage_ptr__,2,3);
    *pSVar4 = fVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix4f get_modelview() const
    {
        if (camera_type == CameraType::Orthographic)
        {
            Eigen::Matrix4f modelview = Eigen::Matrix4f::Identity();
            modelview.block<3, 3>(0, 0) = rotation.normalized().toRotationMatrix();
            modelview(0, 3) = t_x;
            modelview(1, 3) = t_y;
            return modelview;
        } else
        {
            assert(t_z.has_value()); // Might be worth throwing an exception instead.
            Eigen::Matrix4f modelview = Eigen::Matrix4f::Identity();
            modelview.block<3, 3>(0, 0) = rotation.normalized().toRotationMatrix();
            modelview(0, 3) = t_x;
            modelview(1, 3) = t_y;
            modelview(2, 3) = t_z.value();
            return modelview;
        }
    }